

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O0

uint8_t * svb_decode_scalar(uint32_t *outPtr,uint8_t *keyPtr,uint8_t *dataPtr,uint32_t count)

{
  uint32_t uVar1;
  uint in_ECX;
  uint8_t *in_RDX;
  byte *in_RSI;
  uint32_t *in_RDI;
  uint32_t val;
  uint32_t c;
  uint32_t key;
  uint8_t shift;
  uint local_30;
  uint local_2c;
  byte local_25;
  uint8_t *local_20;
  byte *local_18;
  uint32_t *local_10;
  uint8_t *local_8;
  
  local_8 = in_RDX;
  if (in_ECX != 0) {
    local_25 = 0;
    local_18 = in_RSI + 1;
    local_2c = (uint)*in_RSI;
    local_20 = in_RDX;
    local_10 = in_RDI;
    for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
      if (local_25 == 8) {
        local_25 = 0;
        local_2c = (uint)*local_18;
        local_18 = local_18 + 1;
      }
      uVar1 = _decode_data(&local_20,(byte)(local_2c >> (local_25 & 0x1f)) & 3);
      *local_10 = uVar1;
      local_25 = local_25 + 2;
      local_10 = local_10 + 1;
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

uint8_t *svb_decode_scalar(uint32_t *outPtr, const uint8_t *keyPtr,
                           uint8_t *dataPtr, uint32_t count) {
  if (count == 0)
    return dataPtr; // no reads or writes if no data

  uint8_t shift = 0;
  uint32_t key = *keyPtr++;
  for (uint32_t c = 0; c < count; c++) {
    if (shift == 8) {
      shift = 0;
      key = *keyPtr++;
    }
    uint32_t val = _decode_data(&dataPtr, (key >> shift) & 0x3);
    *outPtr++ = val;
    shift += 2;
  }

  return dataPtr; // pointer to first unused byte after end
}